

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_ManBmcDfs_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if (((ulong)pObj & 1) == 0) {
    if (pObj->TravId != p->nTravIds) {
      pObj->TravId = p->nTravIds;
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        Saig_ManBmcDfs_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
        Saig_ManBmcDfs_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
      }
      uVar1 = vNodes->nSize;
      if (uVar1 == vNodes->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar2 = vNodes->nSize;
      vNodes->nSize = iVar2 + 1;
      ppvVar3[iVar2] = pObj;
    }
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                ,0x168,"void Saig_ManBmcDfs_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Saig_ManBmcDfs_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManBmcDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
        Saig_ManBmcDfs_rec( p, Aig_ObjFanin1(pObj), vNodes );
    }
    Vec_PtrPush( vNodes, pObj );
}